

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::lts_20250127::debugging_internal::ParseSeqId(State *state)

{
  char cVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  
  iVar2 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar2 + 1;
  state->steps = iVar3 + 1;
  if (iVar3 < 0x20000 && iVar2 < 0x100) {
    iVar3 = (state->parse_state).mangled_idx;
    lVar5 = 0;
    while ((cVar1 = state->mangled_begin[lVar5 + iVar3], cVar1 != '\0' &&
           ((byte)(cVar1 - 0x30U) < 10 || (byte)(cVar1 + 0xbfU) < 0x1a))) {
      lVar5 = lVar5 + 1;
    }
    if (lVar5 != 0) {
      (state->parse_state).mangled_idx = iVar3 + (int)lVar5;
      bVar4 = true;
      goto LAB_0021c921;
    }
  }
  bVar4 = false;
LAB_0021c921:
  state->recursion_depth = iVar2;
  return bVar4;
}

Assistant:

explicit ComplexityGuard(State *state) : state_(state) {
    ++state->recursion_depth;
    ++state->steps;
  }